

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cc
# Opt level: O2

void __thiscall board::Board::print(Board *this)

{
  ostream *poVar1;
  int *piVar2;
  int iVar3;
  char *pcVar4;
  int file;
  long lVar5;
  
  pcVar4 = "     black";
  if (this->side == 0) {
    pcVar4 = "     white";
  }
  poVar1 = std::operator<<((ostream *)&std::cout,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar1);
  piVar2 = this->board + 0x5b;
  for (iVar3 = 7; -1 < iVar3; iVar3 = iVar3 + -1) {
    for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
      poVar1 = std::operator<<((ostream *)&std::cout,PIECE_CHARS[piVar2[lVar5]]);
      std::operator<<(poVar1," ");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    piVar2 = piVar2 + -10;
  }
  return;
}

Assistant:

void board::Board::print() const
{
    int square;
    int piece;
    if (side == WHITE) {
        std::cout << "     white" << std::endl;
    }
    else {
        std::cout << "     black" << std::endl;
    }
    for (int rank = RANK_8; rank >= RANK_1; rank--) {
        for (int file = FILE_A; file <= FILE_H; file++) {
            square = FR2SQ(file, rank);
            piece = board[square];
            std::cout << PIECE_CHARS[piece] << " ";
        }
        std::cout << std::endl;
    }
}